

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

bool __thiscall wabt::WastParser::ParseVarOpt(WastParser *this,Var *out_var,Var *default_var)

{
  bool bVar1;
  Result result_00;
  Result result;
  Var *default_var_local;
  Var *out_var_local;
  WastParser *this_local;
  
  bVar1 = PeekMatch(this,Last_Literal,0);
  if ((!bVar1) && (bVar1 = PeekMatch(this,Last_String,0), !bVar1)) {
    Var::operator=(out_var,default_var);
    return false;
  }
  result_00 = ParseVar(this,out_var);
  bVar1 = Succeeded(result_00);
  if (bVar1) {
    return true;
  }
  __assert_fail("Succeeded(result)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/wast-parser.cc"
                ,0x31b,"bool wabt::WastParser::ParseVarOpt(Var *, Var)");
}

Assistant:

bool WastParser::ParseVarOpt(Var* out_var, Var default_var) {
  WABT_TRACE(ParseVarOpt);
  if (PeekMatch(TokenType::Nat) || PeekMatch(TokenType::Var)) {
    Result result = ParseVar(out_var);
    // Should always succeed, the only way it could fail is if the token
    // doesn't match.
    assert(Succeeded(result));
    WABT_USE(result);
    return true;
  } else {
    *out_var = default_var;
    return false;
  }
}